

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

value class_metadata_attributes_impl(char *name,size_t size,set attributes)

{
  set_cb_iterate iterate_cb;
  value *args;
  value pvVar1;
  set in_RDX;
  class_metadata_iterator_args_type iterator;
  value *v_array;
  value v;
  size_t in_stack_ffffffffffffffb8;
  value *in_stack_ffffffffffffffc0;
  
  iterate_cb = (set_cb_iterate)
               value_create_array(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (iterate_cb != (set_cb_iterate)0x0) {
    args = value_to_array((value)0x127116);
    pvVar1 = value_create_string((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *args = pvVar1;
    if (*args != (value)0x0) {
      set_size(in_RDX);
      pvVar1 = value_create_array(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      args[1] = pvVar1;
      if (args[1] != (value)0x0) {
        set_iterate(in_RDX,iterate_cb,args);
        return iterate_cb;
      }
    }
    value_type_destroy((value)size);
  }
  return (value)0x0;
}

Assistant:

value class_metadata_attributes_impl(const char name[], size_t size, set attributes)
{
	value v = value_create_array(NULL, 2);
	value *v_array;

	if (v == NULL)
	{
		return NULL;
	}

	v_array = value_to_array(v);
	v_array[0] = value_create_string(name, size - 1);

	if (v_array[0] == NULL)
	{
		goto error_value;
	}

	v_array[1] = value_create_array(NULL, set_size(attributes));

	if (v_array[1] == NULL)
	{
		goto error_value;
	}

	struct class_metadata_iterator_args_type iterator;

	iterator.v = v_array[1];
	iterator.count = 0;

	set_iterate(attributes, &class_metadata_attributes_impl_cb_iterate, &iterator);

	return v;
error_value:
	value_type_destroy(v);
	return NULL;
}